

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::TextureCubeMipmapCase::init(TextureCubeMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TextureCube *this_01;
  TextureCube *pTVar3;
  PixelBufferAccess *access;
  RGBA local_7c;
  Vec4 local_78;
  uint local_68;
  uint local_64;
  deUint32 color;
  deUint32 rgb;
  deUint32 dec;
  deUint32 inc;
  deUint32 step;
  int levelNdx;
  int faceNdx;
  int numLevels;
  allocator<char> local_31;
  string local_30;
  TextureCubeMipmapCase *local_10;
  TextureCubeMipmapCase *this_local;
  
  local_10 = this;
  if (this->m_coordType == COORDTYPE_PROJECTED) {
    iVar1 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    iVar1 = tcu::RenderTarget::getNumSamples((RenderTarget *)CONCAT44(extraout_var,iVar1));
    if (0 < iVar1) {
      faceNdx._3_1_ = 1;
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,
                 "Projected lookup validation not supported in multisample config",&local_31);
      tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
      faceNdx._3_1_ = 0;
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  this_01 = (TextureCube *)operator_new(0x180);
  glu::TextureCube::TextureCube
            (this_01,this->m_renderCtx,this->m_format,this->m_dataType,this->m_size);
  this->m_texture = this_01;
  iVar1 = deLog2Floor32(this->m_size);
  dVar2 = iVar1 + 1;
  step = 0;
  levelNdx = dVar2;
  while ((int)step < 6) {
    for (inc = 0; (int)inc < levelNdx; inc = inc + 1) {
      dec = (deUint32)(0xff / (long)(levelNdx + -1));
      rgb = ::deClamp32(dec * inc,0,0xff);
      color = 0xff - rgb;
      local_64 = 0;
      switch(step) {
      case 0:
        local_64 = rgb << 0x10 | color * 0x100 | 0xff;
        break;
      case 1:
        local_64 = rgb << 8 | 0xff0000 | color;
        break;
      case 2:
        local_64 = color * 0x10000 | 0xff00 | rgb;
        break;
      case 3:
        local_64 = color * 0x10000 | rgb << 8 | 0xff;
        break;
      case 4:
        local_64 = color * 0x100 | 0xff0000 | rgb;
        break;
      case 5:
        local_64 = rgb << 0x10 | 0xff00 | color;
      }
      local_68 = local_64 | 0xff000000;
      pTVar3 = glu::TextureCube::getRefTexture(this->m_texture);
      tcu::TextureCube::allocLevel(pTVar3,step,inc);
      pTVar3 = glu::TextureCube::getRefTexture(this->m_texture);
      access = tcu::TextureCube::getLevelFace(pTVar3,inc,step);
      tcu::RGBA::RGBA(&local_7c,local_68);
      tcu::RGBA::toVec((RGBA *)&local_78);
      tcu::clear(access,&local_78);
    }
    dVar2 = step + 1;
    step = dVar2;
  }
  return dVar2;
}

Assistant:

void TextureCubeMipmapCase::init (void)
{
	if (m_coordType == COORDTYPE_PROJECTED && m_renderCtx.getRenderTarget().getNumSamples() > 0)
		throw tcu::NotSupportedError("Projected lookup validation not supported in multisample config");

	m_texture = new glu::TextureCube(m_renderCtx, m_format, m_dataType, m_size);

	int numLevels = deLog2Floor32(m_size)+1;

	// Fill texture with colored grid.
	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step		= 0xff / (numLevels-1);
			deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
			deUint32	dec			= 0xff - inc;
			deUint32	rgb			= 0;

			switch (faceNdx)
			{
				case 0: rgb = (inc << 16) | (dec << 8) | 255; break;
				case 1: rgb = (255 << 16) | (inc << 8) | dec; break;
				case 2: rgb = (dec << 16) | (255 << 8) | inc; break;
				case 3: rgb = (dec << 16) | (inc << 8) | 255; break;
				case 4: rgb = (255 << 16) | (dec << 8) | inc; break;
				case 5: rgb = (inc << 16) | (255 << 8) | dec; break;
			}

			deUint32	color		= 0xff000000 | rgb;

			m_texture->getRefTexture().allocLevel((tcu::CubeFace)faceNdx, levelNdx);
			tcu::clear(m_texture->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)faceNdx), tcu::RGBA(color).toVec());
		}
	}
}